

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O0

void localUnref(mpt_metatype *mt)

{
  _mpt_vptr_metatype *p_Var1;
  long lVar2;
  mpt_local_output *lo;
  mpt_metatype *mt_local;
  
  lVar2 = mpt_refcount_lower(mt + 4);
  if (lVar2 == 0) {
    mpt_history_fini((mpt_history *)(mt + 6));
    p_Var1 = mt[5]._vptr;
    if (p_Var1 != (_mpt_vptr_metatype *)0x0) {
      (**(code **)((p_Var1->convertable).convert + 8))(p_Var1);
    }
    free(mt);
  }
  return;
}

Assistant:

static void localUnref(MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(local_output) *lo = (void *) mt;
	
	/* remove active reference */
	if (mpt_refcount_lower(&lo->ref)) {
		return;
	}
	mpt_history_fini(&lo->hist);
	
	if ((mt = (void *) lo->pass)) {
		mt->_vptr->unref(mt);
	}
	free(lo);
}